

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fibonacci.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  ostream *this;
  int local_244;
  string local_240 [4];
  int num;
  string line;
  istream local_220 [8];
  ifstream stream;
  char **argv_local;
  int argc_local;
  
  std::ifstream::ifstream(local_220,argv[1],8);
  std::__cxx11::string::string(local_240);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_240);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    local_244 = std::__cxx11::stoi((string *)local_240,(size_t *)0x0,10);
    if (-1 < local_244) {
      iVar2 = genFibonacci(&local_244);
      this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
  }
  std::__cxx11::string::~string(local_240);
  std::ifstream::~ifstream(local_220);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    ifstream stream(argv[1]);
//    ifstream stream("/home/arkezar/fib");
    string line;
    int num;
    while (getline(stream, line)) {
        num = stoi(line);
        if(num >= 0){

            cout << genFibonacci(num) << endl;
        }
    }
    return 0;
}